

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ReadSizeAndPushLimitAndDepth
          (ParseContext *this,char *ptr,int *old_limit)

{
  uint32_t limit;
  int iVar1;
  int size;
  int *old_limit_local;
  char *ptr_local;
  ParseContext *this_local;
  
  old_limit_local = (int *)ptr;
  ptr_local = (char *)this;
  limit = ReadSize((char **)&old_limit_local);
  if (old_limit_local == (int *)0x0) {
    *old_limit = 0;
    this_local = (ParseContext *)0x0;
  }
  else {
    iVar1 = EpsCopyInputStream::PushLimit
                      (&this->super_EpsCopyInputStream,(char *)old_limit_local,limit);
    *old_limit = iVar1;
    iVar1 = this->depth_ + -1;
    this->depth_ = iVar1;
    if (iVar1 < 0) {
      this_local = (ParseContext *)0x0;
    }
    else {
      this_local = (ParseContext *)old_limit_local;
    }
  }
  return (char *)this_local;
}

Assistant:

const char* ParseContext::ReadSizeAndPushLimitAndDepth(const char* ptr,
                                                       int* old_limit) {
  int size = ReadSize(&ptr);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) {
    *old_limit = 0;  // Make sure this isn't uninitialized even on error return
    return nullptr;
  }
  *old_limit = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  return ptr;
}